

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O0

optional<int>
wallet::ReadPragmaInteger(sqlite3 *db,string *key,string *description,bilingual_str *error)

{
  int iVar1;
  undefined4 uVar2;
  char *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  char **in_RDX;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  int ret;
  int result;
  sqlite3_stmt *pragma_read_stmt;
  string stmt_text;
  bilingual_str *in_stack_fffffffffffffe58;
  bilingual_str *in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  char **in_stack_fffffffffffffe88;
  string *in_stack_fffffffffffffe90;
  char *fmt;
  undefined8 local_f8;
  _Optional_payload_base<int> local_f0 [25];
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  fmt = local_28;
  tinyformat::format<std::__cxx11::string>
            ((char *)in_stack_fffffffffffffe88,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
  local_f8 = 0;
  pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     (&in_stack_fffffffffffffe58->original);
  iVar1 = sqlite3_prepare_v2(in_RDI,pcVar3,0xffffffff,&local_f8,0);
  if (iVar1 == 0) {
    iVar1 = sqlite3_step(local_f8);
    if (iVar1 == 100) {
      uVar2 = sqlite3_column_int(local_f8,0);
      sqlite3_finalize(local_f8);
      std::optional<int>::optional<int,_true>
                ((optional<int> *)CONCAT44(uVar2,in_stack_fffffffffffffe68),
                 (int *)in_stack_fffffffffffffe60);
    }
    else {
      sqlite3_finalize(local_f8);
      sqlite3_errstr(iVar1);
      tinyformat::format<std::__cxx11::string,char_const*>
                (fmt,in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
      Untranslated(in_stack_fffffffffffffe90);
      bilingual_str::operator=
                ((bilingual_str *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                 in_stack_fffffffffffffe60);
      bilingual_str::~bilingual_str(in_stack_fffffffffffffe58);
      std::__cxx11::string::~string(&in_stack_fffffffffffffe58->original);
      std::optional<int>::optional((optional<int> *)local_f0);
    }
  }
  else {
    sqlite3_finalize(local_f8);
    args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           sqlite3_errstr(iVar1);
    tinyformat::format<std::__cxx11::string,char_const*>(fmt,args,in_RDX);
    Untranslated(args);
    bilingual_str::operator=
              ((bilingual_str *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
               in_stack_fffffffffffffe60);
    bilingual_str::~bilingual_str(in_stack_fffffffffffffe58);
    std::__cxx11::string::~string(&in_stack_fffffffffffffe58->original);
    std::optional<int>::optional((optional<int> *)local_f0);
  }
  std::__cxx11::string::~string(&in_stack_fffffffffffffe58->original);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (optional<int>)local_f0[0];
  }
  __stack_chk_fail();
}

Assistant:

static std::optional<int> ReadPragmaInteger(sqlite3* db, const std::string& key, const std::string& description, bilingual_str& error)
{
    std::string stmt_text = strprintf("PRAGMA %s", key);
    sqlite3_stmt* pragma_read_stmt{nullptr};
    int ret = sqlite3_prepare_v2(db, stmt_text.c_str(), -1, &pragma_read_stmt, nullptr);
    if (ret != SQLITE_OK) {
        sqlite3_finalize(pragma_read_stmt);
        error = Untranslated(strprintf("SQLiteDatabase: Failed to prepare the statement to fetch %s: %s", description, sqlite3_errstr(ret)));
        return std::nullopt;
    }
    ret = sqlite3_step(pragma_read_stmt);
    if (ret != SQLITE_ROW) {
        sqlite3_finalize(pragma_read_stmt);
        error = Untranslated(strprintf("SQLiteDatabase: Failed to fetch %s: %s", description, sqlite3_errstr(ret)));
        return std::nullopt;
    }
    int result = sqlite3_column_int(pragma_read_stmt, 0);
    sqlite3_finalize(pragma_read_stmt);
    return result;
}